

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O0

CURLcode operate(GlobalConfig *global,int argc,char **argv)

{
  int iVar1;
  ParameterError PVar2;
  CURLcode CVar3;
  CURLSH *share_00;
  bool local_61;
  char *local_60;
  CURLcode r2;
  CURLSH *share;
  OperationConfig *operation;
  size_t count;
  ParameterError res;
  char *first_arg;
  CURLcode result;
  char **argv_local;
  int argc_local;
  GlobalConfig *global_local;
  
  first_arg._4_4_ = CURLE_OK;
  if (argc < 2) {
    local_60 = (char *)0x0;
  }
  else {
    local_60 = argv[1];
  }
  setlocale(6,"");
  setlocale(1,"C");
  if (((argc == 1) ||
      (((local_60 != (char *)0x0 && (iVar1 = strncmp(local_60,"-q",2), iVar1 != 0)) &&
       (iVar1 = strcmp(local_60,"--disable"), iVar1 != 0)))) &&
     ((parseconfig((char *)0x0,global), argc < 2 && (global->first->url_list == (getout *)0x0)))) {
    helpf(tool_stderr,(char *)0x0);
    first_arg._4_4_ = CURLE_FAILED_INIT;
  }
  if (first_arg._4_4_ == CURLE_OK) {
    PVar2 = parse_args(global,argc,argv);
    if (PVar2 == PARAM_OK) {
      if (global->libcurl != (char *)0x0) {
        first_arg._4_4_ = easysrc_init();
      }
      if (first_arg._4_4_ == CURLE_OK) {
        operation = (OperationConfig *)0x0;
        share = global->first;
        share_00 = (CURLSH *)curl_share_init();
        if (share_00 == (CURLSH *)0x0) {
          if (global->libcurl != (char *)0x0) {
            easysrc_cleanup();
          }
          first_arg._4_4_ = CURLE_OUT_OF_MEMORY;
        }
        if (first_arg._4_4_ == CURLE_OK) {
          curl_share_setopt(share_00,1,2);
          curl_share_setopt(share_00,1,3);
          curl_share_setopt(share_00,1,4);
          if ((*(ushort *)&global->field_0x63 & 1) == 0) {
            curl_share_setopt(share_00,1,5);
          }
          curl_share_setopt(share_00,1,6);
          curl_share_setopt(share_00,1,7);
          if ((global->ssl_sessions != (char *)0x0) && ((feature_ssls_export & 1U) != 0)) {
            first_arg._4_4_ = tool_ssls_load(global,global->first,share_00,global->ssl_sessions);
          }
          if (first_arg._4_4_ == CURLE_OK) {
            do {
              CVar3 = get_args((OperationConfig *)share,(size_t)operation);
              share = *(CURLSH **)((long)share + 0x3c0);
              local_61 = CVar3 == CURLE_OK && share != (CURLSH *)0x0;
              operation = (OperationConfig *)((long)&(operation->state).urlnode + 1);
            } while (local_61);
            global->current = global->first;
            first_arg._4_4_ = run_all_transfers(global,share_00,CVar3);
            if ((((global->ssl_sessions != (char *)0x0) && ((feature_ssls_export & 1U) != 0)) &&
                (CVar3 = tool_ssls_save(global,global->first,share_00,global->ssl_sessions),
                CVar3 != CURLE_OK)) && (first_arg._4_4_ == CURLE_OK)) {
              first_arg._4_4_ = CVar3;
            }
          }
          curl_share_cleanup(share_00);
          if (global->libcurl != (char *)0x0) {
            easysrc_cleanup();
            dumpeasysrc(global);
          }
        }
      }
      else {
        errorf(global,"out of memory");
      }
    }
    else {
      first_arg._4_4_ = CURLE_OK;
      if (PVar2 == PARAM_HELP_REQUESTED) {
        tool_help(global->help_category);
      }
      else if (PVar2 == PARAM_MANUAL_REQUESTED) {
        hugehelp();
      }
      else if (PVar2 == PARAM_VERSION_INFO_REQUESTED) {
        tool_version_info();
      }
      else if (PVar2 == PARAM_ENGINES_REQUESTED) {
        tool_list_engines();
      }
      else if (PVar2 != PARAM_CA_EMBED_REQUESTED) {
        if (PVar2 == PARAM_LIBCURL_UNSUPPORTED_PROTOCOL) {
          first_arg._4_4_ = CURLE_UNSUPPORTED_PROTOCOL;
        }
        else if (PVar2 == PARAM_READ_ERROR) {
          first_arg._4_4_ = CURLE_READ_ERROR;
        }
        else {
          first_arg._4_4_ = CURLE_FAILED_INIT;
        }
      }
    }
  }
  varcleanup(global);
  curl_free(global->knownhosts);
  return first_arg._4_4_;
}

Assistant:

CURLcode operate(struct GlobalConfig *global, int argc, argv_item_t argv[])
{
  CURLcode result = CURLE_OK;
  const char *first_arg;
#ifdef UNDER_CE
  first_arg = argc > 1 ? strdup(argv[1]) : NULL;
#else
  first_arg = argc > 1 ? convert_tchar_to_UTF8(argv[1]) : NULL;
#endif

#ifdef HAVE_SETLOCALE
  /* Override locale for number parsing (only) */
  setlocale(LC_ALL, "");
  setlocale(LC_NUMERIC, "C");
#endif

  /* Parse .curlrc if necessary */
  if((argc == 1) ||
     (first_arg && strncmp(first_arg, "-q", 2) &&
      strcmp(first_arg, "--disable"))) {
    parseconfig(NULL, global); /* ignore possible failure */

    /* If we had no arguments then make sure a url was specified in .curlrc */
    if((argc < 2) && (!global->first->url_list)) {
      helpf(tool_stderr, NULL);
      result = CURLE_FAILED_INIT;
    }
  }

  unicodefree(first_arg);

  if(!result) {
    /* Parse the command line arguments */
    ParameterError res = parse_args(global, argc, argv);
    if(res) {
      result = CURLE_OK;

      /* Check if we were asked for the help */
      if(res == PARAM_HELP_REQUESTED)
        tool_help(global->help_category);
      /* Check if we were asked for the manual */
      else if(res == PARAM_MANUAL_REQUESTED) {
#ifdef USE_MANUAL
        hugehelp();
#else
        puts("built-in manual was disabled at build-time");
#endif
      }
      /* Check if we were asked for the version information */
      else if(res == PARAM_VERSION_INFO_REQUESTED)
        tool_version_info();
      /* Check if we were asked to list the SSL engines */
      else if(res == PARAM_ENGINES_REQUESTED)
        tool_list_engines();
      /* Check if we were asked to dump the embedded CA bundle */
      else if(res == PARAM_CA_EMBED_REQUESTED) {
#ifdef CURL_CA_EMBED
        printf("%s", curl_ca_embed);
#endif
      }
      else if(res == PARAM_LIBCURL_UNSUPPORTED_PROTOCOL)
        result = CURLE_UNSUPPORTED_PROTOCOL;
      else if(res == PARAM_READ_ERROR)
        result = CURLE_READ_ERROR;
      else
        result = CURLE_FAILED_INIT;
    }
    else {
      if(global->libcurl) {
        /* Initialise the libcurl source output */
        result = easysrc_init();
      }

      /* Perform the main operations */
      if(!result) {
        size_t count = 0;
        struct OperationConfig *operation = global->first;
        CURLSH *share = curl_share_init();
        if(!share) {
          if(global->libcurl) {
            /* Cleanup the libcurl source output */
            easysrc_cleanup();
          }
          result = CURLE_OUT_OF_MEMORY;
        }

        if(!result) {
          curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_COOKIE);
          curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_DNS);
          curl_share_setopt(share, CURLSHOPT_SHARE,
                            CURL_LOCK_DATA_SSL_SESSION);
          /* Running parallel, use the multi connection cache */
          if(!global->parallel)
            curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_CONNECT);
          curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_PSL);
          curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_HSTS);

          if(global->ssl_sessions && feature_ssls_export)
            result = tool_ssls_load(global, global->first, share,
                                    global->ssl_sessions);

          if(!result) {
            /* Get the required arguments for each operation */
            do {
              result = get_args(operation, count++);

              operation = operation->next;
            } while(!result && operation);

            /* Set the current operation pointer */
            global->current = global->first;

            /* now run! */
            result = run_all_transfers(global, share, result);

            if(global->ssl_sessions && feature_ssls_export) {
              CURLcode r2 = tool_ssls_save(global, global->first, share,
                                           global->ssl_sessions);
              if(r2 && !result)
                result = r2;
            }
          }

          curl_share_cleanup(share);
          if(global->libcurl) {
            /* Cleanup the libcurl source output */
            easysrc_cleanup();

            /* Dump the libcurl code if previously enabled */
            dumpeasysrc(global);
          }
        }
      }
      else
        errorf(global, "out of memory");
    }
  }

  varcleanup(global);
  curl_free(global->knownhosts);

  return result;
}